

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

istream * operator>>(istream *i,Scope *s)

{
  int iVar1;
  ostream *poVar2;
  char c;
  Index Index;
  
  c = '\0';
  std::operator>>(i,&c);
  iVar1 = (int)i;
  if (c != '<') {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "Scope extraction error: expected \'<\', but got \'");
    poVar2 = std::operator<<(poVar2,c);
    poVar2 = std::operator<<(poVar2,"\' !");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ios::setstate((int)*(undefined8 *)(*(long *)i + -0x18) + iVar1);
  }
  while (*(int *)(i + *(long *)(*(long *)i + -0x18) + 0x20) == 0) {
    std::istream::_M_extract<unsigned_int>((uint *)i);
    if (*(int *)(i + *(long *)(*(long *)i + -0x18) + 0x20) == 0) {
      Scope::Insert(s,Index);
    }
  }
  std::ios::clear((int)*(long *)(*(long *)i + -0x18) + iVar1);
  std::operator>>(i,&c);
  if (c != '>') {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "Scope extraction error: expected \'>\', but got \'");
    poVar2 = std::operator<<(poVar2,c);
    poVar2 = std::operator<<(poVar2,"\' !");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ios::setstate((int)*(undefined8 *)(*(long *)i + -0x18) + iVar1);
  }
  return i;
}

Assistant:

istream& operator>> (istream& i, Scope& s)
{
    char c = 0;
    i >> c;
    if(c != '<')
    {
        cerr << "Scope extraction error: expected '<', but got '"<<c<<"' !" << endl;
        i.setstate(ios_base::failbit);
    }
    while( i.good() )
    {
        Index Index;
        i >> Index;   
#if 0        
        cout << "parsed Index="<<Index;
        cout << ",\ti.good="<<i.good();
        cout << ",\ti.eof="<<i.eof();
        cout << ",\ti.fail="<<i.fail();
        cout << ",\ti.bad="<<i.bad()<<endl;
#endif        
        if(i.good() )
            s.Insert(Index);
    }
    //failed to parse an Index
    i.clear(); //reset status
    i >> c;
    if(c != '>')
    {
        cerr << "Scope extraction error: expected '>', but got '"<<c<<"' !" << endl;
        i.setstate(ios_base::failbit);
    }

    return i;
}